

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx2::forwardDilation_x86
          (Convolution_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  size_t _elemsize;
  _func_int *p_Var13;
  size_t sVar14;
  void *pvVar15;
  size_t sVar16;
  _func_int **pp_Var17;
  Layer *pLVar18;
  ulong uVar19;
  int *piVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  Allocator *pAVar24;
  int iVar25;
  int iVar26;
  uint _w;
  undefined4 *puVar27;
  long lVar28;
  int iVar29;
  undefined4 *puVar30;
  Allocator *pAVar31;
  ulong uVar32;
  ulong uVar33;
  uint _h;
  undefined4 *puVar34;
  bool bVar35;
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  Option opt_g;
  long local_188;
  long local_170;
  Mat local_168;
  Mat local_118;
  long local_c8;
  long local_c0;
  ulong local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  long local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  
  iVar8 = bottom_blob->w;
  iVar9 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  p_Var13 = this->_vptr_Convolution_x86_avx2[-3];
  iVar10 = *(int *)((long)&(this->weight_data_3x3_winograd63).d + (long)p_Var13);
  iVar11 = *(int *)((long)&(this->weight_data_3x3_winograd63).cstep + (long)(p_Var13 + 4));
  uVar12 = *(uint *)(&(this->weight_data_3x3_winograd63).field_0x3c + (long)p_Var13);
  uVar22 = (ulong)uVar12;
  iVar26 = (iVar10 + -1) * uVar12 + 1;
  iVar21 = (iVar8 - iVar26) / iVar11;
  iVar25 = iVar21 + 1;
  Mat::create(top_blob,iVar25,(iVar9 - iVar26) / iVar11 + 1,
              *(int *)((long)&(this->weight_data_3x3_winograd63).h + (long)p_Var13),_elemsize,
              opt->blob_allocator);
  iVar26 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_118.cstep = 0;
    local_168.data = (Allocator *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_118.elemsize = SUB168(ZEXT816(0) << 0x40,4);
    local_168.elempack = 0;
    local_168.cstep = 0;
    bVar35 = 0 < (int)uVar12;
    local_168.elemsize = local_118.elemsize;
    local_168.allocator = (Allocator *)local_168.data;
    local_168.dims = (int)local_168.refcount;
    local_168.w = local_168.refcount._4_4_;
    local_168._48_8_ = local_118.elemsize;
    local_168.c = local_168.elempack;
    local_118.data = local_168.data;
    local_118.refcount._0_4_ = (int)local_168.refcount;
    local_118.refcount._4_4_ = local_168.refcount._4_4_;
    local_118.elempack = local_168.elempack;
    local_118.allocator = (Allocator *)local_168.data;
    local_118.dims = (int)local_168.refcount;
    local_118.w = local_168.refcount._4_4_;
    local_118._48_8_ = local_118.elemsize;
    local_118.c = local_168.elempack;
    if (0 < (int)uVar12) {
      local_c0 = (long)iVar8 << 2;
      local_c8 = (long)iVar21 * 4 + 4;
      local_80 = (long)(int)(iVar25 * uVar12) << 2;
      local_188 = 0;
      local_170 = 0;
      uVar32 = 0;
      do {
        uVar19 = (long)(int)((uVar12 + iVar9 + -1) - (int)uVar32) / (long)(int)uVar12;
        iVar21 = (int)uVar19;
        uVar23 = (long)(iVar21 - iVar10) / (long)iVar11;
        local_98 = uVar23 & 0xffffffff;
        _h = (int)uVar23 + 1;
        uVar23 = 0;
        local_b8 = uVar32;
        local_b0 = local_170;
        local_a8 = local_188;
        do {
          uVar32 = (long)(int)((uVar12 + iVar8 + -1) - (int)uVar23) / (long)(int)uVar12;
          iVar25 = (int)uVar32;
          iVar26 = (iVar25 - iVar10) / iVar11;
          local_a0 = uVar23;
          Mat::create(&local_118,iVar25,iVar21,bottom_blob->c,_elemsize,opt->workspace_allocator);
          if (((Allocator *)local_118.data == (Allocator *)0x0) ||
             ((long)local_118.c * local_118.cstep == 0)) {
LAB_001872b0:
            iVar26 = -100;
            if (bVar35) goto LAB_001872dc;
            goto LAB_001872bc;
          }
          _w = iVar26 + 1;
          Mat::create(&local_168,_w,_h,
                      *(int *)((long)&(this->weight_data_3x3_winograd63).h +
                              (long)this->_vptr_Convolution_x86_avx2[-3]),_elemsize,
                      opt->workspace_allocator);
          if (((Allocator *)local_168.data == (Allocator *)0x0) ||
             ((long)local_168.c * local_168.cstep == 0)) goto LAB_001872b0;
          local_88 = (long)bottom_blob->c;
          if (0 < local_88) {
            local_90 = local_118.cstep * local_118.elemsize;
            lVar28 = 0;
            pAVar24 = (Allocator *)local_118.data;
            do {
              if (0 < iVar21) {
                sVar14 = bottom_blob->cstep;
                pvVar15 = bottom_blob->data;
                sVar16 = bottom_blob->elemsize;
                iVar29 = 0;
                uVar23 = 0;
                pAVar31 = pAVar24;
                do {
                  if (0 < iVar25) {
                    puVar27 = (undefined4 *)
                              ((long)pvVar15 +
                              (long)iVar29 * 4 + sVar14 * sVar16 * lVar28 + local_170);
                    uVar33 = 0;
                    do {
                      *(undefined4 *)((long)&pAVar31->_vptr_Allocator + uVar33 * 4) = *puVar27;
                      uVar33 = uVar33 + 1;
                      puVar27 = puVar27 + uVar22;
                    } while ((uVar32 & 0xffffffff) != uVar33);
                  }
                  uVar23 = uVar23 + 1;
                  iVar29 = iVar29 + uVar12 * iVar8;
                  pAVar31 = (Allocator *)((long)&pAVar31->_vptr_Allocator + (long)iVar25 * 4);
                } while (uVar23 != (uVar19 & 0xffffffff));
              }
              lVar28 = lVar28 + 1;
              pAVar24 = (Allocator *)((long)&pAVar24->_vptr_Allocator + local_90);
            } while (lVar28 != local_88);
          }
          auVar1[0] = opt->lightmode;
          auVar1._1_3_ = *(undefined3 *)&opt->field_0x1;
          auVar1._4_4_ = opt->num_threads;
          auVar1._8_8_ = opt->blob_allocator;
          uVar2 = opt->workspace_allocator;
          uVar3 = opt->openmp_blocktime;
          uVar4 = opt->use_winograd_convolution;
          uVar5 = opt->use_sgemm_convolution;
          uVar6 = opt->use_int8_inference;
          uVar7 = opt->use_vulkan_compute;
          auVar1[0x1f] = uVar7;
          auVar1[0x1e] = uVar6;
          auVar1[0x1d] = uVar5;
          auVar1[0x1c] = uVar4;
          auVar1._24_4_ = uVar3;
          auVar1._16_8_ = uVar2;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          local_58._4_1_ = opt->use_int8_packed;
          local_58._5_1_ = opt->use_int8_storage;
          local_58._6_1_ = opt->use_int8_arithmetic;
          local_58._7_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_50._4_1_ = opt->use_subgroup_shuffle;
          uStack_50._5_1_ = opt->use_image_storage;
          uStack_50._6_1_ = opt->use_tensor_storage;
          uStack_50._7_1_ = opt->use_weight_fp16_storage;
          uStack_48._0_4_ = opt->flush_denormals;
          uStack_48._4_1_ = opt->use_local_pool_allocator;
          uStack_48._5_1_ = opt->use_reserved_1;
          uStack_48._6_1_ = opt->use_reserved_2;
          uStack_48._7_1_ = opt->use_reserved_3;
          uStack_40._0_1_ = opt->use_reserved_4;
          uStack_40._1_1_ = opt->use_reserved_5;
          uStack_40._2_1_ = opt->use_reserved_6;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_40._4_1_ = opt->use_reserved_8;
          uStack_40._5_1_ = opt->use_reserved_9;
          uStack_40._6_1_ = opt->use_reserved_10;
          uStack_40._7_1_ = opt->use_reserved_11;
          local_78 = auVar1._0_8_;
          pAStack_70 = local_168.allocator;
          auStack_68 = auVar1._16_16_;
          (*this->convolution_dilation1->_vptr_Layer[7])
                    (this->convolution_dilation1,&local_118,&local_168,&local_78);
          pp_Var17 = this->_vptr_Convolution_x86_avx2;
          if (0 < *(int *)((long)&(this->weight_data_3x3_winograd63).h + (long)pp_Var17[-3])) {
            sVar14 = top_blob->cstep;
            sVar16 = top_blob->elemsize;
            puVar27 = (undefined4 *)((long)top_blob->data + local_188);
            lVar28 = 0;
            do {
              if (-1 < (int)local_98) {
                pAVar24 = (Allocator *)
                          ((long)(_func_int ***)local_168.data +
                          local_168.cstep * local_168.elemsize * lVar28);
                uVar32 = 0;
                puVar30 = puVar27;
                do {
                  if (-1 < iVar26) {
                    uVar23 = 0;
                    puVar34 = puVar30;
                    do {
                      *puVar34 = *(undefined4 *)((long)&pAVar24->_vptr_Allocator + uVar23 * 4);
                      uVar23 = uVar23 + 1;
                      puVar34 = puVar34 + uVar22;
                    } while (_w != uVar23);
                  }
                  uVar32 = uVar32 + 1;
                  puVar30 = (undefined4 *)((long)puVar30 + local_80);
                  pAVar24 = (Allocator *)((long)&pAVar24->_vptr_Allocator + (long)(int)_w * 4);
                } while (uVar32 != _h);
              }
              lVar28 = lVar28 + 1;
              puVar27 = (undefined4 *)((long)puVar27 + sVar14 * sVar16);
            } while (lVar28 < *(int *)((long)&(this->weight_data_3x3_winograd63).h +
                                      (long)pp_Var17[-3]));
          }
          uVar23 = local_a0 + 1;
          local_170 = local_170 + 4;
          local_188 = local_188 + 4;
        } while (uVar23 != uVar22);
        uVar32 = local_b8 + 1;
        bVar35 = uVar32 < uVar22;
        local_170 = local_b0 + local_c0;
        local_188 = local_a8 + local_c8;
      } while (uVar32 != uVar22);
    }
LAB_001872bc:
    pLVar18 = this->activation;
    if (pLVar18 == (Layer *)0x0) {
      iVar26 = 0;
    }
    else {
      (*pLVar18->_vptr_Layer[9])(pLVar18,top_blob,opt);
      iVar26 = 0;
    }
LAB_001872dc:
    piVar20 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_168.data != (Allocator *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar20 = (int *)CONCAT44(local_118.refcount._4_4_,(int)local_118.refcount);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_118.data != (Allocator *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar26;
}

Assistant:

int Convolution_x86_avx2::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}